

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

void __thiscall QLineEdit::cut(QLineEdit *this)

{
  QWidgetLineControl *this_00;
  EVP_PKEY_CTX *in_RDX;
  
  this_00 = *(QWidgetLineControl **)(*(long *)&(this->super_QWidget).field_0x8 + 600);
  if ((*(long *)(this_00 + 0x28) != 0) && (*(int *)(this_00 + 0x110) < *(int *)(this_00 + 0x114))) {
    QWidgetLineControl::copy(this_00,(EVP_PKEY_CTX *)0x0,in_RDX);
    QWidgetLineControl::del
              (*(QWidgetLineControl **)(*(long *)&(this->super_QWidget).field_0x8 + 600));
    return;
  }
  return;
}

Assistant:

void QLineEdit::cut()
{
    if (hasSelectedText()) {
        copy();
        del();
    }
}